

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::ShaderVkImpl::ShaderVkImpl
          (ShaderVkImpl *this,IReferenceCounters *pRefCounters,RenderDeviceVkImpl *pRenderDeviceVk,
          ShaderCreateInfo *ShaderCI,CreateInfo *VkShaderCI,bool IsDeviceInternal)

{
  IThreadPool *pIVar1;
  IShaderSourceInputStreamFactory *pIVar2;
  IMemoryAllocator *RawAllocator;
  pointer pAVar3;
  RefCountersImpl *pRVar4;
  TaskImpl *pTVar5;
  long lVar6;
  char (*Args_1) [26];
  RenderDeviceInfo *pRVar7;
  RENDER_DEVICE_TYPE *pRVar8;
  pointer __p;
  byte bVar9;
  string msg;
  string local_950;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_930;
  pointer local_928;
  RefCntAutoPtr<TaskImpl> local_920;
  _Head_base<0UL,_Diligent::AsyncInitializer_*,_false> local_918;
  PipelineStateImplType *local_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  char *local_8e0;
  undefined8 local_8d8;
  undefined4 local_8d0;
  undefined8 local_8c8;
  undefined4 local_8c0;
  undefined1 local_8bc;
  char *local_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined5 uStack_898;
  undefined3 uStack_893;
  undefined5 uStack_890;
  undefined8 uStack_88b;
  ulong local_883;
  undefined7 uStack_87b;
  undefined4 uStack_874;
  IShaderSourceInputStreamFactory *local_870;
  _Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false> _Stack_868;
  void *local_860;
  undefined1 local_858 [952];
  PipelineStateImplType *local_4a0;
  ShaderCreateInfoWrapper local_498;
  IDXCompiler *local_3e8;
  RENDER_DEVICE_TYPE local_3e0 [26];
  undefined1 local_378 [824];
  Uint32 local_40;
  undefined1 local_3c;
  IDataBlob **local_38;
  
  bVar9 = 0;
  ShaderBase<Diligent::EngineVkImplTraits>::ShaderBase
            (&this->super_ShaderBase<Diligent::EngineVkImplTraits>,pRefCounters,pRenderDeviceVk,
             &ShaderCI->Desc,VkShaderCI->DeviceInfo,VkShaderCI->AdapterInfo,IsDeviceInternal);
  (this->super_ShaderBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>.
  super_ObjectBase<Diligent::IShaderVk>.super_RefCountedObject<Diligent::IShaderVk>.super_IShaderVk.
  super_IShader.super_IDeviceObject = (IDeviceObject)&PTR_QueryInterface_00920268;
  (this->m_pShaderResources).
  super___shared_ptr<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_pShaderResources).
  super___shared_ptr<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_930 = &(this->m_EntryPoint).field_2;
  (this->m_EntryPoint)._M_dataplus._M_p = (pointer)local_930;
  (this->m_EntryPoint)._M_string_length = 0;
  (this->m_EntryPoint).field_2._M_local_buf[0] = '\0';
  (this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LOCK();
  (this->super_ShaderBase<Diligent::EngineVkImplTraits>).m_Status._M_i = SHADER_STATUS_COMPILING;
  UNLOCK();
  pIVar1 = VkShaderCI->pCompilationThreadPool;
  if (((pIVar1 == (IThreadPool *)0x0) ||
      ((ShaderCI->CompileFlags & SHADER_COMPILE_FLAG_ASYNCHRONOUS) == SHADER_COMPILE_FLAG_NONE)) ||
     (ShaderCI->ByteCode != (void *)0x0)) {
    Initialize(this,ShaderCI,VkShaderCI);
  }
  else {
    local_4a0 = (PipelineStateImplType *)this;
    RawAllocator = GetRawAllocator();
    ShaderCreateInfoWrapper::ShaderCreateInfoWrapper(&local_498,ShaderCI,RawAllocator);
    local_3e8 = VkShaderCI->pDXCompiler;
    pRVar7 = VkShaderCI->DeviceInfo;
    pRVar8 = local_3e0;
    for (lVar6 = 0x1a; lVar6 != 0; lVar6 = lVar6 + -1) {
      *pRVar8 = pRVar7->Type;
      pRVar7 = (RenderDeviceInfo *)((long)pRVar7 + (ulong)bVar9 * -8 + 4);
      pRVar8 = pRVar8 + (ulong)bVar9 * -2 + 1;
    }
    memcpy(local_378,VkShaderCI->AdapterInfo,0x334);
    local_40 = VkShaderCI->VkVersion;
    local_3c = VkShaderCI->HasSpirv14;
    local_38 = VkShaderCI->ppCompilerOutput;
    pAVar3 = (pointer)operator_new(0x18);
    local_910 = local_4a0;
    memcpy(&local_908,&local_498,0x98);
    _Stack_868._M_head_impl.m_Allocator =
         (STDDeleter<void,_Diligent::IMemoryAllocator>)
         (STDDeleter<void,_Diligent::IMemoryAllocator>)
         local_498.m_pRawMemory._M_t.
         super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
         super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
         super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>;
    local_870 = local_498.m_SourceFactory.m_pObject;
    local_498.m_SourceFactory.m_pObject = (IShaderSourceInputStreamFactory *)0x0;
    local_498.m_pRawMemory._M_t.
    super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
    super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
    super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
    super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>.
    _M_head_impl.m_Allocator =
         (_Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>)
         (STDDeleter<void,_Diligent::IMemoryAllocator>)0x0;
    local_860 = local_498.m_pRawMemory._M_t.
                super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                ._M_t.
                super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                .super__Head_base<0UL,_void_*,_false>._M_head_impl;
    local_498.m_pRawMemory._M_t.
    super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
    super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
    super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)0x0;
    local_950._M_dataplus._M_p._3_5_ = 0;
    local_950._M_string_length._0_3_ = 0;
    local_950._M_string_length._3_4_ = 0;
    local_950._15_4_ = 0;
    local_498.m_CreateInfo.field_4.SourceLength = 0;
    local_498.m_CreateInfo.Source = (Char *)0x0;
    local_498.m_CreateInfo.ByteCode = (void *)0x0;
    local_498.m_CreateInfo.FilePath = (Char *)0x0;
    local_498.m_CreateInfo.pShaderSourceStreamFactory = (IShaderSourceInputStreamFactory *)0x0;
    Args_1 = (char (*) [26])0x6f745a;
    local_498.m_CreateInfo.EntryPoint = "main";
    local_498.m_CreateInfo.Macros.Elements = (ShaderMacro *)0x0;
    local_498.m_CreateInfo.Macros.Count = 0;
    local_498.m_CreateInfo.Desc.super_DeviceObjectAttribs.Name = (Char *)0x0;
    local_498.m_CreateInfo.Desc.ShaderType = SHADER_TYPE_UNKNOWN;
    local_498.m_CreateInfo.Desc.UseCombinedTextureSamplers = false;
    local_498.m_CreateInfo.Desc.CombinedSamplerSuffix = "_sampler";
    local_498.m_CreateInfo.SourceLanguage = SHADER_SOURCE_LANGUAGE_DEFAULT;
    local_498.m_CreateInfo.ShaderCompiler = SHADER_COMPILER_DEFAULT;
    local_498.m_CreateInfo.HLSLVersion.Major = 0;
    local_498.m_CreateInfo.HLSLVersion.Minor = 0;
    local_498.m_CreateInfo.GLSLVersion.Major = 0;
    local_498.m_CreateInfo.GLSLVersion.Minor = 0;
    local_498.m_CreateInfo.GLESSLVersion._0_5_ = 0;
    local_498.m_CreateInfo.GLESSLVersion.Minor._1_3_ = 0;
    local_498.m_CreateInfo.MSLVersion._0_5_ = 0;
    local_498.m_CreateInfo._125_8_ = 0;
    local_498.m_CreateInfo._133_8_ = ZEXT38((uint3)local_950._M_dataplus._M_p);
    local_498.m_CreateInfo._141_7_ = 0;
    local_498.m_CreateInfo.WebGPUEmulatedArrayIndexSuffix._4_4_ = 0;
    memcpy(local_858,&local_3e8,0x3b8);
    local_928 = pAVar3;
    pRVar4 = (RefCountersImpl *)operator_new(0x30);
    (pRVar4->super_IReferenceCounters)._vptr_IReferenceCounters =
         (_func_int **)&PTR_AddStrongRef_0091b8e8;
    (pRVar4->m_ObjectState)._M_i = NotInitialized;
    pRVar4->m_ObjectWrapperBuffer[0] = 0;
    pRVar4->m_ObjectWrapperBuffer[1] = 0;
    pRVar4->m_ObjectWrapperBuffer[2] = 0;
    *(undefined8 *)&(pRVar4->m_NumStrongReferences).super___atomic_base<int> = 0;
    (pRVar4->m_Lock).m_IsLocked._M_base._M_i = false;
    pTVar5 = (TaskImpl *)malloc(0x490);
    (pTVar5->super_AsyncTaskBase).super_ObjectBase<Diligent::IAsyncTask>.
    super_RefCountedObject<Diligent::IAsyncTask>.super_IAsyncTask.super_IObject._vptr_IObject =
         (_func_int **)&PTR___cxa_pure_virtual_0091e3d0;
    CheckDynamicType<Diligent::RefCountersImpl,Diligent::IReferenceCounters>
              ((IReferenceCounters *)pRVar4);
    (pTVar5->super_AsyncTaskBase).super_ObjectBase<Diligent::IAsyncTask>.
    super_RefCountedObject<Diligent::IAsyncTask>.m_pRefCounters = pRVar4;
    (pTVar5->super_AsyncTaskBase).m_bSafelyCancel._M_base._M_i = false;
    (pTVar5->super_AsyncTaskBase).m_fPriority = 0.0;
    (pTVar5->super_AsyncTaskBase).m_TaskStatus = ASYNC_TASK_STATUS_NOT_STARTED;
    (pTVar5->super_AsyncTaskBase).super_ObjectBase<Diligent::IAsyncTask>.
    super_RefCountedObject<Diligent::IAsyncTask>.super_IAsyncTask.super_IObject._vptr_IObject =
         (_func_int **)&PTR_QueryInterface_00920310;
    (pTVar5->m_Handler).Handler.pThisImpl = local_910;
    memcpy(&(pTVar5->m_Handler).Handler.Shaders,&local_908,0x98);
    pIVar2 = local_870;
    local_870 = (IShaderSourceInputStreamFactory *)0x0;
    *(IShaderSourceInputStreamFactory **)
     ((pTVar5->m_Handler).Handler.CreateInfo.
      super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
      .super_GraphicsPipelineStateCreateInfo.GraphicsPipeline.BlendDesc.RenderTargets + 3) = pIVar2;
    *(STDDeleter<void,_Diligent::IMemoryAllocator> *)
     &(pTVar5->m_Handler).Handler.CreateInfo.
      super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
      .super_GraphicsPipelineStateCreateInfo.GraphicsPipeline.BlendDesc.RenderTargets[3].LogicOp =
         _Stack_868._M_head_impl.m_Allocator;
    _Stack_868._M_head_impl.m_Allocator =
         (STDDeleter<void,_Diligent::IMemoryAllocator>)(IMemoryAllocator *)0x0;
    *(void **)&(pTVar5->m_Handler).Handler.CreateInfo.
               super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
               .super_GraphicsPipelineStateCreateInfo.GraphicsPipeline.BlendDesc.RenderTargets[4].
               DestBlendAlpha = local_860;
    local_860 = (void *)0x0;
    local_950._M_dataplus._M_p._3_5_ = 0;
    local_950._M_string_length._0_3_ = 0;
    local_950._M_string_length._3_4_ = 0;
    local_950._15_4_ = 0;
    local_8e8 = 0;
    local_8f8 = 0;
    uStack_8f0 = 0;
    local_908 = 0;
    uStack_900 = 0;
    local_8e0 = "main";
    local_8d8 = 0;
    local_8d0 = 0;
    local_8c8 = 0;
    local_8c0 = 0;
    local_8bc = 0;
    local_8b8 = "_sampler";
    local_8b0 = 0;
    uStack_8a8 = 0;
    local_8a0 = 0;
    uStack_898 = 0;
    uStack_893 = 0;
    uStack_890 = 0;
    uStack_88b = 0;
    local_883 = (ulong)(uint3)local_950._M_dataplus._M_p;
    uStack_87b = 0;
    uStack_874 = 0;
    memcpy(&(pTVar5->m_Handler).Handler.CreateInfo.
            super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
            .super_GraphicsPipelineStateCreateInfo.GraphicsPipeline.BlendDesc.RenderTargets[5].
            BlendOp,local_858,0x3b8);
    if ((pRVar4->m_ObjectState)._M_i != NotInitialized) {
      FormatString<char[33]>(&local_950,(char (*) [33])"Object has already been attached");
      Args_1 = (char (*) [26])0x10d;
      DebugAssertionFailed
                ((Char *)CONCAT53(local_950._M_dataplus._M_p._3_5_,(uint3)local_950._M_dataplus._M_p
                                 ),"Attach",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
                 ,0x10d);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT53(local_950._M_dataplus._M_p._3_5_,(uint3)local_950._M_dataplus._M_p) !=
          &local_950.field_2) {
        operator_delete((undefined1 *)
                        CONCAT53(local_950._M_dataplus._M_p._3_5_,(uint3)local_950._M_dataplus._M_p)
                        ,CONCAT53(local_950.field_2._M_allocated_capacity._3_5_,
                                  local_950.field_2._M_allocated_capacity._0_3_) + 1);
      }
    }
    pAVar3 = local_928;
    pRVar4->m_ObjectWrapperBuffer[0] = (size_t)&PTR_DestroyObject_009203b0;
    pRVar4->m_ObjectWrapperBuffer[1] = (size_t)pTVar5;
    pRVar4->m_ObjectWrapperBuffer[2] = 0;
    LOCK();
    (pRVar4->m_ObjectState)._M_i = Alive;
    UNLOCK();
    pRVar4 = (pTVar5->super_AsyncTaskBase).super_ObjectBase<Diligent::IAsyncTask>.
             super_RefCountedObject<Diligent::IAsyncTask>.m_pRefCounters;
    local_920.m_pObject = pTVar5;
    if (pRVar4 == (RefCountersImpl *)0x0) {
      FormatString<char[26],char[26]>
                (&local_950,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pRefCounters != nullptr",Args_1);
      DebugAssertionFailed
                ((Char *)CONCAT53(local_950._M_dataplus._M_p._3_5_,(uint3)local_950._M_dataplus._M_p
                                 ),"AddRef",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
                 ,0x221);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT53(local_950._M_dataplus._M_p._3_5_,(uint3)local_950._M_dataplus._M_p) !=
          &local_950.field_2) {
        operator_delete((undefined1 *)
                        CONCAT53(local_950._M_dataplus._M_p._3_5_,(uint3)local_950._M_dataplus._M_p)
                        ,CONCAT53(local_950.field_2._M_allocated_capacity._3_5_,
                                  local_950.field_2._M_allocated_capacity._0_3_) + 1);
      }
      pRVar4 = (pTVar5->super_AsyncTaskBase).super_ObjectBase<Diligent::IAsyncTask>.
               super_RefCountedObject<Diligent::IAsyncTask>.m_pRefCounters;
    }
    RefCountersImpl::AddStrongRef(pRVar4);
    (*(pIVar1->super_IObject)._vptr_IObject[4])(pIVar1,pTVar5,0,0);
    local_950._M_dataplus._M_p._0_3_ = (uint3)pTVar5;
    local_950._M_dataplus._M_p._3_5_ = (undefined5)((ulong)pTVar5 >> 0x18);
    local_920.m_pObject = (TaskImpl *)0x0;
    RefCntAutoPtr<TaskImpl>::~RefCntAutoPtr(&local_920);
    (pAVar3->m_Status)._M_i = ASYNC_TASK_STATUS_NOT_STARTED;
    (pAVar3->m_TaskLock).m_IsLocked._M_base._M_i = false;
    RefCntWeakPtr<Diligent::IAsyncTask>::RefCntWeakPtr
              (&pAVar3->m_wpTask,(RefCntAutoPtr<Diligent::IAsyncTask> *)&local_950);
    local_918._M_head_impl = pAVar3;
    if ((long *)CONCAT53(local_950._M_dataplus._M_p._3_5_,(uint3)local_950._M_dataplus._M_p) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT53(local_950._M_dataplus._M_p._3_5_,
                                     (uint3)local_950._M_dataplus._M_p) + 0x10))();
      local_950._M_dataplus._M_p._0_3_ = 0;
      local_950._M_dataplus._M_p._3_5_ = 0;
    }
    if (local_860 != (void *)0x0) {
      STDDeleter<void,_Diligent::IMemoryAllocator>::operator()(&_Stack_868._M_head_impl,local_860);
    }
    local_860 = (void *)0x0;
    if (local_870 != (IShaderSourceInputStreamFactory *)0x0) {
      (**(code **)(*(long *)local_870 + 0x10))();
    }
    local_918._M_head_impl = (AsyncInitializer *)0x0;
    std::
    __uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>::
    reset((__uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
           *)&(this->super_ShaderBase<Diligent::EngineVkImplTraits>).m_AsyncInitializer,pAVar3);
    std::unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>::
    ~unique_ptr((unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
                 *)&local_918);
    if (local_498.m_pRawMemory._M_t.
        super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
        super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
        super__Head_base<0UL,_void_*,_false>._M_head_impl != (void *)0x0) {
      STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
                ((STDDeleter<void,_Diligent::IMemoryAllocator> *)&local_498.m_pRawMemory,
                 local_498.m_pRawMemory._M_t.
                 super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                 .super__Head_base<0UL,_void_*,_false>._M_head_impl);
    }
    local_498.m_pRawMemory._M_t.
    super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
    super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
    super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)0x0;
    if (local_498.m_SourceFactory.m_pObject != (IShaderSourceInputStreamFactory *)0x0) {
      (*((local_498.m_SourceFactory.m_pObject)->super_IObject)._vptr_IObject[2])();
    }
  }
  return;
}

Assistant:

ShaderVkImpl::ShaderVkImpl(IReferenceCounters*     pRefCounters,
                           RenderDeviceVkImpl*     pRenderDeviceVk,
                           const ShaderCreateInfo& ShaderCI,
                           const CreateInfo&       VkShaderCI,
                           bool                    IsDeviceInternal) :
    // clang-format off
    TShaderBase
    {
        pRefCounters,
        pRenderDeviceVk,
        ShaderCI.Desc,
        VkShaderCI.DeviceInfo,
        VkShaderCI.AdapterInfo,
        IsDeviceInternal
    }
// clang-format on
{
    m_Status.store(SHADER_STATUS_COMPILING);
    if (VkShaderCI.pCompilationThreadPool == nullptr || (ShaderCI.CompileFlags & SHADER_COMPILE_FLAG_ASYNCHRONOUS) == 0 || ShaderCI.ByteCode != nullptr)
    {
        Initialize(ShaderCI, VkShaderCI);
    }
    else
    {
        this->m_AsyncInitializer = AsyncInitializer::Start(
            VkShaderCI.pCompilationThreadPool,
            [this,
             ShaderCI         = ShaderCreateInfoWrapper{ShaderCI, GetRawAllocator()},
             pDXCompiler      = VkShaderCI.pDXCompiler,
             DeviceInfo       = VkShaderCI.DeviceInfo,
             AdapterInfo      = VkShaderCI.AdapterInfo,
             VkVersion        = VkShaderCI.VkVersion,
             HasSpirv14       = VkShaderCI.HasSpirv14,
             ppCompilerOutput = VkShaderCI.ppCompilerOutput](Uint32 ThreadId) mutable //
            {
                try
                {
                    const CreateInfo VkShaderCI{
                        pDXCompiler,
                        DeviceInfo,
                        AdapterInfo,
                        VkVersion,
                        HasSpirv14,
                        ppCompilerOutput,
                        nullptr,
                    };
                    Initialize(ShaderCI, VkShaderCI);
                }
                catch (...)
                {
                    m_Status.store(SHADER_STATUS_FAILED);
                }
                ShaderCI = ShaderCreateInfoWrapper{};
            });
    }
}